

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O0

void sfd_cb(void *arg,uint events)

{
  int iVar1;
  nni_sfd_conn *c;
  uint events_local;
  void *arg_local;
  
  if ((events & 0x38) == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0xb0));
    if ((events & 1) != 0) {
      sfd_doread((nni_sfd_conn *)arg);
    }
    if ((events & 4) != 0) {
      sfd_dowrite((nni_sfd_conn *)arg);
    }
    c._4_4_ = 0;
    iVar1 = nni_list_empty((nni_list *)((long)arg + 0x90));
    if (iVar1 == 0) {
      c._4_4_ = 4;
    }
    iVar1 = nni_list_empty((nni_list *)((long)arg + 0x78));
    if (iVar1 == 0) {
      c._4_4_ = c._4_4_ | 1;
    }
    if (((*(byte *)((long)arg + 0xa8) & 1) == 0) && (c._4_4_ != 0)) {
      nni_posix_pfd_arm((nni_posix_pfd *)((long)arg + 0x38),c._4_4_);
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0xb0));
  }
  else {
    sfd_error(arg,0x1f);
  }
  return;
}

Assistant:

static void
sfd_cb(void *arg, unsigned events)
{
	struct nni_sfd_conn *c = arg;

	if (events & (NNI_POLL_HUP | NNI_POLL_ERR | NNI_POLL_INVAL)) {
		sfd_error(c, NNG_ECONNSHUT);
		return;
	}
	nni_mtx_lock(&c->mtx);
	if ((events & NNI_POLL_IN) != 0) {
		sfd_doread(c);
	}
	if ((events & NNI_POLL_OUT) != 0) {
		sfd_dowrite(c);
	}
	events = 0;
	if (!nni_list_empty(&c->writeq)) {
		events |= NNI_POLL_OUT;
	}
	if (!nni_list_empty(&c->readq)) {
		events |= NNI_POLL_IN;
	}
	if ((!c->closed) && (events != 0)) {
		nni_posix_pfd_arm(&c->pfd, events);
	}
	nni_mtx_unlock(&c->mtx);
}